

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

void psocks_plug_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,
                    int error_code)

{
  psocks_connection *conn;
  _Bool _Var1;
  char *fmt;
  char addrbuf [256];
  char acStack_128 [264];
  
  if (((ulong)plug[-10].vt[1].log & 1) == 0) {
    return;
  }
  if (PLUGLOG_PROXY_MSG < type) {
    return;
  }
  conn = (psocks_connection *)(plug + -10);
  switch(type) {
  case PLUGLOG_CONNECT_TRYING:
    sk_getaddr(addr,acStack_128,0x100);
    _Var1 = sk_addr_needs_port(addr);
    if (_Var1) {
      psocks_conn_log(conn,"trying to connect to %s port %d",acStack_128,(ulong)(uint)port);
    }
    else {
      psocks_conn_log(conn,"trying to connect to %s",acStack_128);
    }
    break;
  case PLUGLOG_CONNECT_FAILED:
    fmt = "connection attempt failed: %s";
    goto LAB_00104f76;
  case PLUGLOG_CONNECT_SUCCESS:
    psocks_conn_log(conn,"connection established",error_msg);
    if (*(char *)&plug[-3].vt == '\x01') {
      (**(code **)((plug[-9].vt)->log + 8))();
      *(undefined1 *)&plug[-3].vt = 0;
    }
    break;
  case PLUGLOG_PROXY_MSG:
    fmt = "connection setup: %s";
LAB_00104f76:
    psocks_conn_log(conn,fmt,error_msg);
    return;
  }
  return;
}

Assistant:

static void psocks_plug_log(Plug *plug, PlugLogType type, SockAddr *addr,
                            int port, const char *error_msg, int error_code)
{
    psocks_connection *conn = container_of(plug, psocks_connection, plug);
    char addrbuf[256];

    if (!(conn->ps->log_flags & LOG_CONNSTATUS))
        return;

    switch (type) {
      case PLUGLOG_CONNECT_TRYING:
        sk_getaddr(addr, addrbuf, sizeof(addrbuf));
        if (sk_addr_needs_port(addr))
            psocks_conn_log(conn, "trying to connect to %s port %d",
                            addrbuf, port);
        else
            psocks_conn_log(conn, "trying to connect to %s", addrbuf);
        break;
      case PLUGLOG_CONNECT_FAILED:
        psocks_conn_log(conn, "connection attempt failed: %s", error_msg);
        break;
      case PLUGLOG_CONNECT_SUCCESS:
        psocks_conn_log(conn, "connection established", error_msg);
        if (conn->connecting) {
            chan_open_confirmation(conn->chan);
            conn->connecting = false;
        }
        break;
      case PLUGLOG_PROXY_MSG:
        psocks_conn_log(conn, "connection setup: %s", error_msg);
        break;
    };
}